

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  allocator<int> *this;
  bool bVar1;
  int iVar2;
  NodeId NVar3;
  uint uVar4;
  reference piVar5;
  int local_f0;
  int i;
  double global_elapsed;
  double elapsed;
  timer timer;
  NodeId *x_1;
  iterator __end2_1;
  iterator __begin2_1;
  NodeList *__range2_1;
  NodeId *x;
  iterator __end2;
  iterator __begin2;
  NodeList *__range2;
  undefined1 local_88 [8];
  NodeList edges;
  undefined1 local_68 [8];
  NodeList vertices;
  int m;
  int n;
  ParallelBFS *bfs;
  communicator local_30 [8];
  communicator world;
  environment local_1a [2];
  environment env;
  char **ppcStack_18;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  ppcStack_18 = argv;
  argv_local._0_4_ = argc;
  boost::mpi::environment::environment(local_1a,(int *)&argv_local,&stack0xffffffffffffffe8,true);
  boost::mpi::communicator::communicator(local_30);
  iVar2 = boost::mpi::communicator::rank();
  if (iVar2 == 0) {
    __isoc99_scanf("%d %d",(undefined1 *)
                           ((long)&vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage + 4),
                   &vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
    this = (allocator<int> *)
           ((long)&edges.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<int>::allocator(this);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_68,
               (long)vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_,this);
    std::allocator<int>::~allocator
              ((allocator<int> *)
               ((long)&edges.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    std::allocator<int>::allocator((allocator<int> *)((long)&__range2 + 7));
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_88,
               (long)(int)vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,
               (allocator<int> *)((long)&__range2 + 7));
    std::allocator<int>::~allocator((allocator<int> *)((long)&__range2 + 7));
    __end2 = std::vector<int,_std::allocator<int>_>::begin
                       ((vector<int,_std::allocator<int>_> *)local_68);
    x = (NodeId *)
        std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)local_68);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                  *)&x);
      if (!bVar1) break;
      piVar5 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&__end2);
      __isoc99_scanf("%d",piVar5);
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end2);
    }
    __end2_1 = std::vector<int,_std::allocator<int>_>::begin
                         ((vector<int,_std::allocator<int>_> *)local_88);
    x_1 = (NodeId *)
          std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)local_88)
    ;
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2_1,
                         (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)&x_1);
      if (!bVar1) break;
      timer.start_time =
           (double)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&__end2_1);
      __isoc99_scanf("%d",timer.start_time);
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end2_1);
    }
    _m = (ParallelBFS *)operator_new(0x68);
    ParallelBFS::ParallelBFS(_m,local_30,(NodeList *)local_68,(NodeList *)local_88);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_88);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_68);
  }
  else {
    _m = (ParallelBFS *)operator_new(0x68);
    ParallelBFS::ParallelBFS(_m,local_30);
  }
  boost::mpi::timer::timer((timer *)&elapsed);
  ParallelBFS::calculate(_m,0);
  global_elapsed = boost::mpi::timer::elapsed((timer *)&elapsed);
  boost::mpi::reduce<double,boost::mpi::minimum<double>>(local_30,&global_elapsed,&i,0);
  iVar2 = boost::mpi::communicator::rank();
  if (iVar2 == 0) {
    fprintf(_stderr,"Running time: %lf s\n",_i);
  }
  local_f0 = 0;
  while( true ) {
    NVar3 = ParallelBFS::size(_m);
    if (NVar3 <= local_f0) break;
    NVar3 = ParallelBFS::get_first_vertex(_m);
    uVar4 = ParallelBFS::get_distance(_m,local_f0);
    printf("%d: %d\n",(ulong)(uint)(NVar3 + local_f0),(ulong)uVar4);
    local_f0 = local_f0 + 1;
  }
  if (_m != (ParallelBFS *)0x0) {
    ParallelBFS::~ParallelBFS(_m);
    operator_delete(_m);
  }
  argv_local._4_4_ = 0;
  boost::mpi::communicator::~communicator(local_30);
  boost::mpi::environment::~environment(local_1a);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[1]) {
  mpi::environment env(argc, argv);
  mpi::communicator world;

  ParallelBFS *bfs;
  if (world.rank() == 0) {
    int n, m;
    scanf("%d %d", &n, &m);
    ParallelBFS::NodeList vertices((size_t)n), edges((size_t)m);
    for (ParallelBFS::NodeId &x : vertices)
      scanf("%d", &x);
    for (ParallelBFS::NodeId &x : edges)
      scanf("%d", &x);
    bfs = new ParallelBFS(world, vertices, edges);
  } else {
    bfs = new ParallelBFS(world);
  }

  mpi::timer timer;
  bfs->calculate(0);
  double elapsed = timer.elapsed(), global_elapsed;
  mpi::reduce(world, elapsed, global_elapsed, mpi::minimum<double>(), 0);
  if (world.rank() == 0)
    fprintf(stderr, "Running time: %lf s\n", global_elapsed);

  for (int i = 0; i < bfs->size(); ++i)
    printf("%d: %d\n", bfs->get_first_vertex() + i, bfs->get_distance(i));
  delete bfs;
  return 0;
}